

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

EffectiveSign __thiscall
anon_unknown.dwarf_52df6e::EffectiveSignVisitor::visit<slang::ast::AssertionInstanceExpression>
          (EffectiveSignVisitor *this,AssertionInstanceExpression *expr)

{
  bool bVar1;
  Type *in_RSI;
  
  slang::not_null<const_slang::ast::Type_*>::operator->
            ((not_null<const_slang::ast::Type_*> *)0x440cec);
  bVar1 = slang::ast::Type::isSigned(in_RSI);
  return (uint)bVar1;
}

Assistant:

EffectiveSign visit(const T& expr) {
        if constexpr (requires { expr.getEffectiveSignImpl(isForConversion); }) {
            if (expr.bad())
                return EffectiveSign::Either;

            return expr.getEffectiveSignImpl(isForConversion);
        }
        else {
            return expr.type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
        }
    }